

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_pi_iterator_t * pi_create_decode_v2(opj_image_t *p_image,opj_cp_v2_t *p_cp,OPJ_UINT32 p_tile_no)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  opj_tcp_v2_t *p_tcp;
  OPJ_UINT32 *p_max_prec;
  OPJ_UINT32 *p_dy_min;
  opj_pi_iterator_t *p_tx1;
  short *psVar4;
  int *piVar5;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  opj_pi_resolution_t *l_res_1;
  opj_image_comp_t *l_img_comp_1;
  opj_pi_comp_t *l_current_comp_1;
  opj_pi_resolution_t *l_res;
  OPJ_UINT32 *l_encoding_value_ptr;
  opj_pi_iterator_t *l_current_pi;
  opj_image_comp_t *l_img_comp;
  opj_pi_comp_t *l_current_comp;
  opj_tccp_t *l_tccp;
  opj_tcp_v2_t *l_tcp;
  opj_pi_iterator_t *l_pi;
  OPJ_UINT32 l_data_stride;
  OPJ_UINT32 l_step_l;
  OPJ_UINT32 l_step_r;
  OPJ_UINT32 l_step_c;
  OPJ_UINT32 l_step_p;
  OPJ_UINT32 l_bound;
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  OPJ_UINT32 **l_tmp_ptr;
  OPJ_UINT32 *l_tmp_data;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 pino;
  opj_pi_iterator_t *p_pi;
  OPJ_UINT32 in_stack_ffffffffffffff1c;
  opj_cp_v2_t *in_stack_ffffffffffffff20;
  opj_pi_resolution_t *poVar6;
  opj_image_t *in_stack_ffffffffffffff28;
  int *piVar7;
  opj_pi_comp_t *local_d0;
  opj_pi_resolution_t *local_c8;
  OPJ_UINT32 *local_c0;
  opj_pi_iterator_t *local_b8;
  int *local_b0;
  opj_pi_comp_t *local_a8;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff7c;
  OPJ_UINT32 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar9;
  opj_image_t *in_stack_ffffffffffffff90;
  int local_68;
  int local_64;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  OPJ_UINT32 in_stack_ffffffffffffffa8;
  OPJ_UINT32 p_max_precision;
  OPJ_UINT32 in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffc0;
  uint uVar10;
  uint uVar11;
  int in_stack_ffffffffffffffc8;
  opj_pi_iterator_t *local_20;
  
  p_tcp = (opj_tcp_v2_t *)(*(long *)(in_RSI + 0x60) + (ulong)in_EDX * 0x1630);
  uVar1 = p_tcp->numpocs + 1;
  uVar8 = 0x84;
  p_max_prec = (OPJ_UINT32 *)malloc((ulong)(uint)(*(int *)(in_RDI + 0x10) * 0x84) << 2);
  if (p_max_prec == (OPJ_UINT32 *)0x0) {
    local_20 = (opj_pi_iterator_t *)0x0;
  }
  else {
    p_dy_min = (OPJ_UINT32 *)malloc((ulong)*(uint *)(in_RDI + 0x10) << 3);
    if (p_dy_min == (OPJ_UINT32 *)0x0) {
      free(p_max_prec);
      local_20 = (opj_pi_iterator_t *)0x0;
    }
    else {
      p_tx1 = pi_create(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c);
      if (p_tx1 == (opj_pi_iterator_t *)0x0) {
        free(p_max_prec);
        free(p_dy_min);
        local_20 = (opj_pi_iterator_t *)0x0;
      }
      else {
        local_c0 = p_max_prec;
        for (uVar11 = 0; uVar11 < *(uint *)(in_RDI + 0x10); uVar11 = uVar11 + 1) {
          *(OPJ_UINT32 **)(p_dy_min + (ulong)uVar11 * 2) = local_c0;
          local_c0 = local_c0 + uVar8;
        }
        p_pi = (opj_pi_iterator_t *)&stack0xffffffffffffffa8;
        get_all_encoding_parameters
                  (in_stack_ffffffffffffff90,
                   (opj_cp_v2_t *)CONCAT44(uVar1,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffff84,(OPJ_INT32 *)CONCAT44(in_stack_ffffffffffffff7c,uVar8),
                   (OPJ_INT32 *)p_tx1,(OPJ_INT32 *)p_tcp,
                   (OPJ_INT32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (OPJ_UINT32 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   p_dy_min,p_max_prec,(OPJ_UINT32 *)CONCAT44(uVar11,in_stack_ffffffffffffffc0),
                   (OPJ_UINT32 **)CONCAT44(in_EDX,in_stack_ffffffffffffffc8));
        iVar9 = 1;
        iVar2 = *(int *)(in_RDI + 0x10) * in_stack_ffffffffffffffa8;
        iVar3 = in_stack_ffffffffffffffac * iVar2;
        local_20 = p_tx1;
        p_max_precision = in_stack_ffffffffffffffa8;
        psVar4 = (short *)calloc((ulong)((p_tcp->numlayers + 1) * iVar3),2);
        p_tx1->include = psVar4;
        if (p_tx1->include == (short *)0x0) {
          free(p_max_prec);
          free(p_dy_min);
          pi_destroy_v2(p_pi,(OPJ_UINT32)((ulong)&stack0xffffffffffffff90 >> 0x20));
          local_20 = (opj_pi_iterator_t *)0x0;
        }
        else {
          memset(p_tx1->include,0,(ulong)((p_tcp->numlayers + 1) * iVar3) << 1);
          local_a8 = p_tx1->comps;
          local_b0 = *(int **)(in_RDI + 0x18);
          p_tx1->tx0 = in_stack_ffffffffffffffa4;
          p_tx1->ty0 = local_64;
          p_tx1->tx1 = in_stack_ffffffffffffffa0;
          p_tx1->ty1 = local_68;
          p_tx1->step_p = iVar9;
          p_tx1->step_c = in_stack_ffffffffffffffa8;
          p_tx1->step_r = iVar2;
          p_tx1->step_l = iVar3;
          for (uVar8 = 0; uVar8 < (uint)p_tx1->numcomps; uVar8 = uVar8 + 1) {
            local_c8 = local_a8->resolutions;
            local_c0 = *(OPJ_UINT32 **)(p_dy_min + (ulong)uVar8 * 2);
            local_a8->dx = *local_b0;
            local_a8->dy = local_b0[1];
            for (uVar11 = 0; uVar11 < (uint)local_a8->numresolutions; uVar11 = uVar11 + 1) {
              local_c8->pdx = *local_c0;
              local_c8->pdy = local_c0[1];
              piVar7 = (int *)(local_c0 + 3);
              local_c8->pw = local_c0[2];
              local_c0 = local_c0 + 4;
              local_c8->ph = *piVar7;
              local_c8 = local_c8 + 1;
            }
            local_a8 = local_a8 + 1;
            local_b0 = local_b0 + 0xe;
          }
          for (uVar8 = 1; local_b8 = p_tx1 + 1, uVar8 < uVar1; uVar8 = uVar8 + 1) {
            local_d0 = p_tx1[1].comps;
            piVar7 = *(int **)(in_RDI + 0x18);
            p_tx1[1].tx0 = in_stack_ffffffffffffffa4;
            p_tx1[1].ty0 = local_64;
            p_tx1[1].tx1 = in_stack_ffffffffffffffa0;
            p_tx1[1].ty1 = local_68;
            p_tx1[1].step_p = iVar9;
            p_tx1[1].step_c = in_stack_ffffffffffffffa8;
            p_tx1[1].step_r = iVar2;
            p_tx1[1].step_l = iVar3;
            for (uVar11 = 0; uVar11 < (uint)p_tx1[1].numcomps; uVar11 = uVar11 + 1) {
              poVar6 = local_d0->resolutions;
              local_c0 = *(OPJ_UINT32 **)(p_dy_min + (ulong)uVar11 * 2);
              local_d0->dx = *piVar7;
              local_d0->dy = piVar7[1];
              for (uVar10 = 0; uVar10 < (uint)local_d0->numresolutions; uVar10 = uVar10 + 1) {
                poVar6->pdx = *local_c0;
                poVar6->pdy = local_c0[1];
                piVar5 = (int *)(local_c0 + 3);
                poVar6->pw = local_c0[2];
                local_c0 = local_c0 + 4;
                poVar6->ph = *piVar5;
                poVar6 = poVar6 + 1;
              }
              local_d0 = local_d0 + 1;
              piVar7 = piVar7 + 0xe;
            }
            p_tx1[1].include = p_tx1->include;
            p_tx1 = local_b8;
          }
          free(p_max_prec);
          free(p_dy_min);
          if (((byte)p_tcp->field_0x1628 >> 1 & 1) == 0) {
            pi_update_decode_not_poc(local_20,p_tcp,p_max_precision,in_stack_ffffffffffffffac);
          }
          else {
            pi_update_decode_poc(local_20,p_tcp,p_max_precision,in_stack_ffffffffffffffac);
          }
        }
      }
    }
  }
  return local_20;
}

Assistant:

opj_pi_iterator_t *pi_create_decode_v2(	opj_image_t *p_image,
										opj_cp_v2_t *p_cp,
										OPJ_UINT32 p_tile_no
										)
{
	// loop
	OPJ_UINT32 pino;
	OPJ_UINT32 compno, resno;

	// to store w, h, dx and dy fro all components and resolutions
	OPJ_UINT32 * l_tmp_data;
	OPJ_UINT32 ** l_tmp_ptr;

	// encoding prameters to set
	OPJ_UINT32 l_max_res;
	OPJ_UINT32 l_max_prec;
	OPJ_INT32 l_tx0,l_tx1,l_ty0,l_ty1;
	OPJ_UINT32 l_dx_min,l_dy_min;
	OPJ_UINT32 l_bound;
	OPJ_UINT32 l_step_p , l_step_c , l_step_r , l_step_l ;
	OPJ_UINT32 l_data_stride;

	// pointers
	opj_pi_iterator_t *l_pi = 00;
	opj_tcp_v2_t *l_tcp = 00;
	const opj_tccp_t *l_tccp = 00;
	opj_pi_comp_t *l_current_comp = 00;
	opj_image_comp_t * l_img_comp = 00;
	opj_pi_iterator_t * l_current_pi = 00;
	OPJ_UINT32 * l_encoding_value_ptr = 00;

	// preconditions in debug
	assert(p_cp != 00);
	assert(p_image != 00);
	assert(p_tile_no < p_cp->tw * p_cp->th);

	// initializations
	l_tcp = &p_cp->tcps[p_tile_no];
	l_bound = l_tcp->numpocs+1;

	l_data_stride = 4 * J2K_MAXRLVLS;
	l_tmp_data = (OPJ_UINT32*)opj_malloc(
		l_data_stride * p_image->numcomps * sizeof(OPJ_UINT32));
	if
		(! l_tmp_data)
	{
		return 00;
	}
	l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
		p_image->numcomps * sizeof(OPJ_UINT32 *));
	if
		(! l_tmp_ptr)
	{
		opj_free(l_tmp_data);
		return 00;
	}

	// memory allocation for pi
	l_pi = pi_create(p_image, p_cp, p_tile_no);
	if (!l_pi) {
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		return 00;
	}

	l_encoding_value_ptr = l_tmp_data;
	// update pointer array
	for
		(compno = 0; compno < p_image->numcomps; ++compno)
	{
		l_tmp_ptr[compno] = l_encoding_value_ptr;
		l_encoding_value_ptr += l_data_stride;
	}
	// get encoding parameters
	get_all_encoding_parameters(p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,&l_max_prec,&l_max_res,l_tmp_ptr);

	// step calculations
	l_step_p = 1;
	l_step_c = l_max_prec * l_step_p;
	l_step_r = p_image->numcomps * l_step_c;
	l_step_l = l_max_res * l_step_r;

	// set values for first packet iterator
	l_current_pi = l_pi;

	// memory allocation for include
	l_current_pi->include = (OPJ_INT16*) opj_calloc((l_tcp->numlayers +1) * l_step_l, sizeof(OPJ_INT16));
	if
		(!l_current_pi->include)
	{
		opj_free(l_tmp_data);
		opj_free(l_tmp_ptr);
		pi_destroy_v2(l_pi, l_bound);
		return 00;
	}
	memset(l_current_pi->include,0, (l_tcp->numlayers + 1) * l_step_l* sizeof(OPJ_INT16));

	// special treatment for the first packet iterator
	l_current_comp = l_current_pi->comps;
	l_img_comp = p_image->comps;
	l_tccp = l_tcp->tccps;

	l_current_pi->tx0 = l_tx0;
	l_current_pi->ty0 = l_ty0;
	l_current_pi->tx1 = l_tx1;
	l_current_pi->ty1 = l_ty1;

	//l_current_pi->dx = l_img_comp->dx;
	//l_current_pi->dy = l_img_comp->dy;

	l_current_pi->step_p = l_step_p;
	l_current_pi->step_c = l_step_c;
	l_current_pi->step_r = l_step_r;
	l_current_pi->step_l = l_step_l;

	/* allocation for components and number of components has already been calculated by pi_create */
	for
		(compno = 0; compno < l_current_pi->numcomps; ++compno)
	{
		opj_pi_resolution_t *l_res = l_current_comp->resolutions;
		l_encoding_value_ptr = l_tmp_ptr[compno];

		l_current_comp->dx = l_img_comp->dx;
		l_current_comp->dy = l_img_comp->dy;
		/* resolutions have already been initialized */
		for
			(resno = 0; resno < l_current_comp->numresolutions; resno++)
		{
			l_res->pdx = *(l_encoding_value_ptr++);
			l_res->pdy = *(l_encoding_value_ptr++);
			l_res->pw =  *(l_encoding_value_ptr++);
			l_res->ph =  *(l_encoding_value_ptr++);
			++l_res;
		}
		++l_current_comp;
		++l_img_comp;
		++l_tccp;
	}
	++l_current_pi;

	for
		(pino = 1 ; pino<l_bound ; ++pino )
	{
		opj_pi_comp_t *l_current_comp = l_current_pi->comps;
		opj_image_comp_t * l_img_comp = p_image->comps;
		l_tccp = l_tcp->tccps;

		l_current_pi->tx0 = l_tx0;
		l_current_pi->ty0 = l_ty0;
		l_current_pi->tx1 = l_tx1;
		l_current_pi->ty1 = l_ty1;
		//l_current_pi->dx = l_dx_min;
		//l_current_pi->dy = l_dy_min;
		l_current_pi->step_p = l_step_p;
		l_current_pi->step_c = l_step_c;
		l_current_pi->step_r = l_step_r;
		l_current_pi->step_l = l_step_l;

		/* allocation for components and number of components has already been calculated by pi_create */
		for
			(compno = 0; compno < l_current_pi->numcomps; ++compno)
		{
			opj_pi_resolution_t *l_res = l_current_comp->resolutions;
			l_encoding_value_ptr = l_tmp_ptr[compno];

			l_current_comp->dx = l_img_comp->dx;
			l_current_comp->dy = l_img_comp->dy;
			/* resolutions have already been initialized */
			for
				(resno = 0; resno < l_current_comp->numresolutions; resno++)
			{
				l_res->pdx = *(l_encoding_value_ptr++);
				l_res->pdy = *(l_encoding_value_ptr++);
				l_res->pw =  *(l_encoding_value_ptr++);
				l_res->ph =  *(l_encoding_value_ptr++);
				++l_res;
			}
			++l_current_comp;
			++l_img_comp;
			++l_tccp;
		}
		// special treatment
		l_current_pi->include = (l_current_pi-1)->include;
		++l_current_pi;
	}
	opj_free(l_tmp_data);
	l_tmp_data = 00;
	opj_free(l_tmp_ptr);
	l_tmp_ptr = 00;
	if
		(l_tcp->POC)
	{
		pi_update_decode_poc (l_pi,l_tcp,l_max_prec,l_max_res);
	}
	else
	{
		pi_update_decode_not_poc(l_pi,l_tcp,l_max_prec,l_max_res);
	}
	return l_pi;
}